

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,CBString *s)

{
  ulong *puVar1;
  uchar splitChar;
  byte bVar2;
  int iVar3;
  CBStringException *this_00;
  long lVar4;
  int iVar5;
  int len;
  allocator local_b9;
  string local_b8;
  CBStringException bstr__cppwrapper_exception;
  anon_struct_64_1_bc116759 chrs;
  
  iVar3 = (s->super_tagbstring).slen;
  if (iVar3 == 1) {
    splitChar = CBString::character(s,0);
    split(this,b,splitChar);
    return;
  }
  if (iVar3 == 0) {
    std::__cxx11::string::string((string *)&local_b8,"CBString::Null splitstring failure",&local_b9)
    ;
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    chrs.content[lVar4] = 0;
  }
  for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    bVar2 = CBString::character(s,iVar5);
    puVar1 = (ulong *)((long)chrs.content + (ulong)(bVar2 >> 2 & 0x38));
    *puVar1 = *puVar1 | 1L << (bVar2 & 0x1f);
    iVar3 = (s->super_tagbstring).slen;
  }
  iVar3 = 0;
  do {
    len = 0;
    for (iVar5 = iVar3; iVar5 < (b->super_tagbstring).slen; iVar5 = iVar5 + 1) {
      bVar2 = CBString::character(b,iVar5);
      if ((*(uint *)((long)chrs.content + (ulong)(bVar2 >> 2 & 0x38)) >> (bVar2 & 0x1f) & 1) != 0)
      break;
      len = len + 1;
    }
    if (iVar3 <= iVar5) {
      CBString::CBString((CBString *)&bstr__cppwrapper_exception,(b->super_tagbstring).data + iVar3,
                         len);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
      emplace_back<Bstrlib::CBString>
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,
                 (CBString *)&bstr__cppwrapper_exception);
      CBString::~CBString((CBString *)&bstr__cppwrapper_exception);
    }
    iVar3 = iVar5 + 1;
    if ((b->super_tagbstring).slen <= iVar5) {
      return;
    }
  } while( true );
}

Assistant:

void CBStringList::split (const CBString& b, const CBString& s) {
struct { unsigned long content[(1 << CHAR_BIT) / 32]; } chrs;
unsigned char c;
int p, i;

	if (s.length() == 0) bstringThrow ("Null splitstring failure");
	if (s.length() == 1) {
		this->split (b, s.character (0));
	} else {

		for (i=0; i < ((1 << CHAR_BIT) / 32); i++) chrs.content[i] = 0x0;
		for (i=0; i < s.length(); i++) {
			c = s.character (i);
			chrs.content[c >> 5] |= ((long)1) << (c & 31);
		}

		p = 0;
		do {
			for (i = p; i < b.length (); i++) {
				c = b.character (i);
				if (chrs.content[c >> 5] & ((long)1) << (c & 31)) break;
			}
			if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
			p = i + 1;
		} while (p <= b.length ());
	}
}